

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform_hwloc.cpp
# Opt level: O1

bool xmrig::Platform::setThreadAffinity(uint64_t cpu_id)

{
  _func_int **pp_Var1;
  uint uVar2;
  int iVar3;
  ICpuInfo *pIVar4;
  long lVar5;
  bool bVar6;
  
  pIVar4 = Cpu::info();
  pp_Var1 = pIVar4[0xf]._vptr_ICpuInfo;
  lVar5 = 0;
  do {
    uVar2 = hwloc_get_type_depth(pp_Var1,3);
    if (uVar2 < 0xfffffffe) {
      if (lVar5 == 0) {
        lVar5 = hwloc_get_obj_by_depth(pp_Var1,uVar2,0);
      }
      else {
        if (*(uint *)(lVar5 + 0x30) != uVar2) goto LAB_001771e8;
        lVar5 = *(long *)(lVar5 + 0x38);
      }
    }
    else {
LAB_001771e8:
      lVar5 = 0;
    }
    if (lVar5 == 0) {
      lVar5 = 0;
      goto LAB_0017721d;
    }
    if (*(int *)(lVar5 + 0x10) == (int)cpu_id) {
LAB_0017721d:
      if (lVar5 == 0) {
        bVar6 = false;
      }
      else {
        iVar3 = hwloc_set_cpubind(pIVar4[0xf]._vptr_ICpuInfo,*(undefined8 *)(lVar5 + 0xb8),6);
        bVar6 = true;
        if (iVar3 < 0) {
          iVar3 = hwloc_set_cpubind(pIVar4[0xf]._vptr_ICpuInfo,*(undefined8 *)(lVar5 + 0xb8),2);
          bVar6 = -1 < iVar3;
        }
      }
      return bVar6;
    }
  } while( true );
}

Assistant:

bool xmrig::Platform::setThreadAffinity(uint64_t cpu_id)
{
    auto cpu       = static_cast<HwlocCpuInfo *>(Cpu::info());
    hwloc_obj_t pu = hwloc_get_pu_obj_by_os_index(cpu->topology(), static_cast<unsigned>(cpu_id));

    if (pu == nullptr) {
        return false;
    }

    if (hwloc_set_cpubind(cpu->topology(), pu->cpuset, HWLOC_CPUBIND_THREAD | HWLOC_CPUBIND_STRICT) >= 0) {
        return true;
    }

    return hwloc_set_cpubind(cpu->topology(), pu->cpuset, HWLOC_CPUBIND_THREAD) >= 0;
}